

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi__uint32 *y_00;
  int *comp_00;
  stbi__uint32 b;
  int iVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  stbi__uint32 c;
  long in_FS_OFFSET;
  
  y_00 = &s->img_y;
  comp_00 = &s->img_n;
  iVar1 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
  if (iVar1 != 0) {
    if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
      *x = s->img_x;
      c = *y_00;
      *y = c;
      iVar1 = *comp_00;
      if (comp != (int *)0x0) {
        *comp = iVar1;
        c = *y_00;
      }
      b = s->img_x;
      iVar2 = stbi__mad3sizes_valid(iVar1,b,c,0);
      if (iVar2 == 0) {
        pcVar3 = "PNM too large";
      }
      else {
        puVar4 = (uchar *)stbi__malloc_mad3(iVar1,b,c,0);
        if (puVar4 != (uchar *)0x0) {
          stbi__getn(s,puVar4,b * iVar1 * c);
          if (req_comp == 0) {
            return puVar4;
          }
          if (*comp_00 == req_comp) {
            return puVar4;
          }
          puVar4 = stbi__convert_format(puVar4,*comp_00,req_comp,s->img_x,s->img_y);
          return puVar4;
        }
        pcVar3 = "Out of memory";
      }
    }
    else {
      pcVar3 = "Very large image (corrupt?)";
    }
    *(char **)(in_FS_OFFSET + -0x10) = pcVar3;
  }
  return (void *)0x0;
}

Assistant:

static void *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   STBI_NOTUSED(ri);

   if (!stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n))
      return 0;

   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;

   if (!stbi__mad3sizes_valid(s->img_n, s->img_x, s->img_y, 0))
      return stbi__errpuc("too large", "PNM too large");

   out = (stbi_uc *) stbi__malloc_mad3(s->img_n, s->img_x, s->img_y, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   stbi__getn(s, out, s->img_n * s->img_x * s->img_y);

   if (req_comp && req_comp != s->img_n) {
      out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}